

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CZ.hpp
# Opt level: O3

void __thiscall
qclab::qgates::CZ<double>::CZ(CZ<double> *this,int control,int target,int controlState)

{
  PauliZ<double> *pPVar1;
  
  QControlledGate2<double>::QControlledGate2
            (&this->super_QControlledGate2<double>,control,controlState);
  (this->super_QControlledGate2<double>).super_QGate2<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0013abc0;
  pPVar1 = (PauliZ<double> *)operator_new(0x10);
  (pPVar1->super_QGate1<double>).qubit_ = target;
  if (target < 0) {
    __assert_fail("qubit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                  ,0x21,"qclab::qgates::QGate1<double>::QGate1(const int) [T = double]");
  }
  (pPVar1->super_QGate1<double>).super_QObject<double> = (QObject<double>)&PTR_nbQubits_0013a498;
  (this->gate_)._M_t.
  super___uniq_ptr_impl<qclab::qgates::PauliZ<double>,_std::default_delete<qclab::qgates::PauliZ<double>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_qclab::qgates::PauliZ<double>_*,_std::default_delete<qclab::qgates::PauliZ<double>_>_>
  .super__Head_base<0UL,_qclab::qgates::PauliZ<double>_*,_false>._M_head_impl = pPVar1;
  if (-1 < control) {
    if (target != control) {
      return;
    }
    __assert_fail("control != target",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CZ.hpp"
                  ,0x2c,
                  "qclab::qgates::CZ<double>::CZ(const int, const int, const int) [T = double]");
  }
  __assert_fail("control >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/CZ.hpp"
                ,0x2b,"qclab::qgates::CZ<double>::CZ(const int, const int, const int) [T = double]")
  ;
}

Assistant:

CZ( const int control , const int target ,
                 const int controlState = 1 )
        : QControlledGate2< T >( control , controlState )
        , gate_( std::make_unique< PauliZ< T > >( target ) )
        {
          assert( control >= 0 ) ; assert( target >= 0 ) ;
          assert( control != target ) ;
        }